

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O1

string * __thiscall
deqp::gls::BuiltinPrecisionTests::FuncCaseFactory::getName_abi_cxx11_
          (string *__return_storage_ptr__,FuncCaseFactory *this)

{
  int iVar1;
  undefined4 extraout_var;
  string local_30;
  
  iVar1 = (*(this->super_CaseFactory)._vptr_CaseFactory[5])(this);
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x10))
            (&local_30,(long *)CONCAT44(extraout_var,iVar1));
  de::toLower(__return_storage_ptr__,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

string					getName		(void) const
	{
		return de::toLower(getFunc().getName());
	}